

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

SearchResult<int,_false> __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
::
binary_search_impl<std::pair<int,int>,phmap::priv::upper_bound_adapter<phmap::Less<std::pair<int,int>>>>
          (btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
           *this,int *k,int s,int e)

{
  bool bVar1;
  int iVar2;
  
  if (s != e) {
    if (((ulong)this & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xf84,
                    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                   );
    }
    do {
      iVar2 = s + e >> 1;
      if (*k < *(int *)(this + (long)iVar2 * 8 + 0xc)) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
        if (*k <= *(int *)(this + (long)iVar2 * 8 + 0xc)) {
          bVar1 = *(int *)(this + (long)iVar2 * 8 + 0x10) <= k[1];
        }
      }
      if (bVar1) {
        s = iVar2 + 1;
        iVar2 = e;
      }
      e = iVar2;
    } while (s != e);
  }
  return (SearchResult<int,_false>)s;
}

Assistant:

SearchResult<int, false> binary_search_impl(
            const K &k, int s, int e, const Compare &comp,
            std::false_type /* IsCompareTo */) const {
            while (s != e) {
                const int mid = (s + e) >> 1;
                if (comp(key(mid), k)) {
                    s = mid + 1;
                } else {
                    e = mid;
                }
            }
            return {s};
        }